

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  size_t thread_count;
  thread_pool *thread_pool;
  FILE *__s;
  int j;
  long lVar2;
  int i;
  long lVar3;
  void *pvVar4;
  timespec t_end;
  timespec t_start;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  void *local_98;
  range local_88;
  undefined8 local_78;
  undefined8 local_70;
  parallel_task_2d local_68;
  undefined8 *local_38;
  
  local_c8 = 0xc002000000000000;
  uStack_c0 = 0x3ff4000000000000;
  local_b8 = 0xbffc000000000000;
  uStack_b0 = 0x3ffc000000000000;
  local_a8 = 0x7d0000007d0;
  local_a0 = 2000;
  local_98 = malloc(16000000);
  thread_count = detect_system_thread_count();
  thread_pool = new_thread_pool(thread_count);
  printf("Thread pool with %zu thread(s) created\n",thread_count);
  timespec_get(&t_start,1);
  local_68.work_item.work_fn = (work_fn_t)0x0;
  local_68.work_item.next = (work_item *)0x0;
  local_68.range[0].begin = 0;
  local_68.range[0].end = 0;
  local_88.begin = 0;
  local_68.range[1].begin = 0;
  local_68.range[1].end = 0;
  local_88.end = 2000;
  local_78 = 0;
  local_70 = 2000;
  local_38 = &local_c8;
  parallel_for_2d(thread_pool,render_task,&local_68,0x38,&local_88);
  timespec_get(&t_end,1);
  free_thread_pool(thread_pool);
  printf("Rendering took %g seconds\n",
         SUB84((double)(t_end.tv_nsec - t_start.tv_nsec) * 1e-09 +
               (double)(t_end.tv_sec - t_start.tv_sec),0));
  pvVar4 = local_98;
  __s = fopen("mandelbrot.ppm","w");
  fwrite("P3\n",3,1,__s);
  fprintf(__s,"%d %d\n",2000,2000);
  fprintf(__s,"%d\n",0xff);
  for (lVar3 = 0; lVar3 != 2000; lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 != 2000; lVar2 = lVar2 + 1) {
      uVar1 = *(uint *)((long)pvVar4 + lVar2 * 4);
      fprintf(__s,"%u %u %u ",(ulong)(uVar1 & 0xff),(ulong)(uVar1 >> 8 & 0xff),
              (ulong)(uVar1 >> 0x10 & 0xff));
    }
    fputc(10,__s);
    pvVar4 = (void *)((long)pvVar4 + 8000);
  }
  fclose(__s);
  printf("Image written to \"%s\"\n","mandelbrot.ppm");
  free(local_98);
  return 0;
}

Assistant:

int main() {
    int m = 2000;
    int n = 2000;

    struct global_data global_data = {
        .x_max =   1.25,
        .x_min = - 2.25,
        .y_max =   1.75,
        .y_min = - 1.75,
        .count_max = 2000,
        .n = n,
        .m = m,
        .pixels = malloc(n * m * sizeof(uint32_t))
    };

#ifdef USE_OPENMP
    const char* output_file = "mandelbrot_omp.ppm";
#else
    size_t thread_count = detect_system_thread_count();
    struct thread_pool* thread_pool = new_thread_pool(thread_count);
    const char* output_file = "mandelbrot.ppm";
    printf("Thread pool with %zu thread(s) created\n", thread_count);
#endif

    struct timespec t_start;
    timespec_get(&t_start, TIME_UTC);
#ifdef USE_OPENMP
    render_tile(&(struct tile) {
        .i = 0, .j = 0, .n = n, .m = m
    }, &global_data);
#else
    parallel_for_2d(
        thread_pool,
        render_task,
        (struct parallel_task_2d*)&(struct render_task) { .global_data = &global_data },
        sizeof(struct render_task),
        (struct range[2]) { {0, n}, {0, m} });
#endif
    struct timespec t_end;
    timespec_get(&t_end, TIME_UTC);

#ifndef USE_OPENMP
    free_thread_pool(thread_pool);
#endif
    printf("Rendering took %g seconds\n", elapsed_seconds(&t_start, &t_end));

    write_ppm(output_file, global_data.pixels, n, m);
    printf("Image written to \"%s\"\n", output_file);

    free(global_data.pixels);
    return 0;
}